

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

void hpa_dalloc_batch(tsdn_t *tsdn,pai_t *self,edata_list_active_t *list,
                     _Bool *deferred_work_generated)

{
  byte *pbVar1;
  edata_t *peVar2;
  void *addr;
  ulong uVar3;
  _Bool _Var4;
  int iVar5;
  hpdata_t *phVar6;
  edata_t *peVar7;
  hpdata_t *ps;
  hpa_shard_t *phVar8;
  
  peVar7 = (list->head).qlh_first;
  while (peVar7 != (edata_t *)0x0) {
    *(ushort *)&peVar7->e_addr = *(ushort *)&peVar7->e_addr & 0xf000;
    pbVar1 = (byte *)((long)&peVar7->e_bits + 1);
    *pbVar1 = *pbVar1 & 0x7f;
    duckdb_je_emap_deregister_boundary(tsdn,(emap_t *)self[100].expand,peVar7);
    peVar7 = (peVar7->field_5).ql_link_active.qre_next;
    if (peVar7 == (list->head).qlh_first) {
      peVar7 = (edata_t *)0x0;
    }
  }
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)&self[2].shrink);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&self[1].alloc_batch);
    *(undefined1 *)&self[2].expand = 1;
  }
  self[2].alloc_batch = self[2].alloc_batch + 1;
  if ((tsdn_t *)self[2].alloc != tsdn) {
    self[2].alloc =
         (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)tsdn;
    self[1].time_until_deferred_work = self[1].time_until_deferred_work + 1;
  }
  peVar7 = (list->head).qlh_first;
  if (peVar7 != (edata_t *)0x0) {
    do {
      peVar2 = (peVar7->field_5).ql_link_active.qre_next;
      (list->head).qlh_first = peVar2;
      if (peVar2 == peVar7) {
        (list->head).qlh_first = (edata_t *)0x0;
      }
      else {
        (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
             (((peVar7->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
        (((peVar7->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
             (peVar7->field_5).ql_link_active.qre_prev;
        peVar2 = (peVar7->field_5).ql_link_active.qre_next;
        (peVar7->field_5).ql_link_active.qre_prev =
             (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
        (((peVar2->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar2;
        (((peVar7->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar7;
      }
      addr = peVar7->e_addr;
      phVar8 = (hpa_shard_t *)peVar7->e_ps;
      uVar3 = (peVar7->field_2).e_size_esn;
      duckdb_je_edata_cache_fast_put(tsdn,(edata_cache_fast_t *)&self[5].expand,peVar7);
      duckdb_je_psset_update_begin((psset_t *)&self[5].dalloc_batch,(hpdata_t *)phVar8);
      duckdb_je_hpdata_unreserve((hpdata_t *)phVar8,addr,uVar3 & 0xfffffffffffff000);
      hpa_update_purge_hugify_eligibility((tsdn_t *)self,phVar8,ps);
      duckdb_je_psset_update_end((psset_t *)&self[5].dalloc_batch,(hpdata_t *)phVar8);
      peVar7 = (list->head).qlh_first;
    } while (peVar7 != (edata_t *)0x0);
  }
  phVar8 = (hpa_shard_t *)self;
  hpa_shard_maybe_do_deferred_work(tsdn,(hpa_shard_t *)self,false);
  phVar6 = duckdb_je_psset_pick_hugify((psset_t *)&self[5].dalloc_batch);
  _Var4 = true;
  if (phVar6 == (hpdata_t *)0x0) {
    _Var4 = hpa_should_purge((tsdn_t *)self,phVar8);
  }
  *deferred_work_generated = _Var4;
  *(undefined1 *)&self[2].expand = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&self[2].shrink);
  return;
}

Assistant:

static void
hpa_dalloc_batch(tsdn_t *tsdn, pai_t *self, edata_list_active_t *list,
    bool *deferred_work_generated) {
	hpa_shard_t *shard = hpa_from_pai(self);

	edata_t *edata;
	ql_foreach(edata, &list->head, ql_link_active) {
		hpa_dalloc_prepare_unlocked(tsdn, shard, edata);
	}

	malloc_mutex_lock(tsdn, &shard->mtx);
	/* Now, remove from the list. */
	while ((edata = edata_list_active_first(list)) != NULL) {
		edata_list_active_remove(list, edata);
		hpa_dalloc_locked(tsdn, shard, edata);
	}
	hpa_shard_maybe_do_deferred_work(tsdn, shard, /* forced */ false);
	*deferred_work_generated =
	    hpa_shard_has_deferred_work(tsdn, shard);

	malloc_mutex_unlock(tsdn, &shard->mtx);
}